

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::mark_refs(CVmObjLookupTable *this,uint state)

{
  vm_lookup_ext *pvVar1;
  CVmObjTable *this_00;
  CVmObjLookupTable *in_RDI;
  vm_lookup_val *entry;
  size_t i;
  vm_lookup_val **bp;
  vm_val_t *val;
  vm_lookup_ext *ext;
  undefined8 in_stack_ffffffffffffffc8;
  vm_lookup_val *pvVar2;
  CVmObjTable *in_stack_ffffffffffffffd0;
  vm_lookup_val **local_28;
  
  pvVar1 = get_ext(in_RDI);
  if ((pvVar1->default_value).typ == VM_OBJ) {
    CVmObjTable::mark_all_refs
              (in_stack_ffffffffffffffd0,(vm_obj_id_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (uint)in_stack_ffffffffffffffc8);
  }
  local_28 = pvVar1->buckets;
  for (this_00 = (CVmObjTable *)(ulong)pvVar1->bucket_cnt; this_00 != (CVmObjTable *)0x0;
      this_00 = (CVmObjTable *)&this_00[-1].field_0x7f) {
    for (pvVar2 = *local_28; pvVar2 != (vm_lookup_val *)0x0; pvVar2 = pvVar2->nxt) {
      if ((pvVar2->key).typ == VM_OBJ) {
        CVmObjTable::mark_all_refs(this_00,(vm_obj_id_t)((ulong)pvVar2 >> 0x20),(uint)pvVar2);
      }
      if ((pvVar2->val).typ == VM_OBJ) {
        CVmObjTable::mark_all_refs(this_00,(vm_obj_id_t)((ulong)pvVar2 >> 0x20),(uint)pvVar2);
      }
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CVmObjLookupTable::mark_refs(VMG_ uint state)
{
    /* get my extension */
    vm_lookup_ext *ext = get_ext();

    /* mark the default value */
    const vm_val_t *val = &ext->default_value;
    if (val->typ == VM_OBJ)
        G_obj_table->mark_all_refs(val->val.obj, state);

    /* run through my buckets */
    vm_lookup_val **bp = ext->buckets;
    size_t i = ext->bucket_cnt;
    for ( ; i != 0 ; ++bp, --i)
    {
        /* run through all entries attached to this bucket */
        for (const vm_lookup_val *entry = *bp ; entry != 0 ;
             entry = entry->nxt)
        {
            /* if the key is an object, mark it as referenced */
            val = &entry->key;
            if  (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);

            /* if the entry is an object, mark it as referenced */
            val = &entry->val;
            if (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);
        }
    }
}